

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

PAL_ERROR CorUnix::InitializeProcessData(void)

{
  bool fLockInitialized;
  PAL_ERROR palError;
  
  pGThreadList = 0;
  g_dwThreadCount = 0;
  InternalInitializeCriticalSection(&g_csProcess);
  return 0;
}

Assistant:

PAL_ERROR
CorUnix::InitializeProcessData(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;
    bool fLockInitialized = FALSE;

    pGThreadList = NULL;
    g_dwThreadCount = 0;

    InternalInitializeCriticalSection(&g_csProcess);
    fLockInitialized = TRUE;

    if (NO_ERROR != palError)
    {
        if (fLockInitialized)
        {
            InternalDeleteCriticalSection(&g_csProcess);
        }
    }

    return palError;
}